

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::parsing::testReaderFail<avro::parsing::ValidatingCodecFactory>(TestData2 *td)

{
  bool bVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *writerCalls;
  Exception *ex;
  auto_ptr<avro::InputStream> in;
  auto_ptr<avro::OutputStream> p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  ValidSchema vs;
  char (*in_stack_fffffffffffffc38) [18];
  undefined1 pv_;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffc40;
  std_string *in_stack_fffffffffffffc48;
  basic_cstring<const_char> *in_stack_fffffffffffffc50;
  auto_ptr<avro::OutputStream> *in_stack_fffffffffffffc58;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffc60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_00;
  basic_cstring<const_char> local_2b8;
  lazy_ostream local_2a8 [2];
  assertion_result local_288;
  OutputStream local_220 [24];
  auto_ptr<avro::OutputStream> local_208 [4];
  pointer in_stack_fffffffffffffe18;
  basic_wrap_stringstream<char> local_1c8;
  basic_cstring<const_char> local_20 [2];
  
  testReaderFail<avro::parsing::ValidatingCodecFactory>::testNo =
       testReaderFail<avro::parsing::ValidatingCodecFactory>::testNo + 1;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
             ,0x6d);
  memset(&local_1c8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffffc40);
  boost::basic_wrap_stringstream<char>::ref(&local_1c8);
  boost::operator<<(in_stack_fffffffffffffc40,(char (*) [7])in_stack_fffffffffffffc38);
  boost::operator<<(in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc38);
  boost::operator<<(in_stack_fffffffffffffc40,*in_stack_fffffffffffffc38);
  boost::operator<<(in_stack_fffffffffffffc40,(char (*) [10])in_stack_fffffffffffffc38);
  boost::operator<<(in_stack_fffffffffffffc40,(char **)in_stack_fffffffffffffc38);
  boost::operator<<(in_stack_fffffffffffffc40,(char (*) [16])in_stack_fffffffffffffc38);
  this = boost::operator<<(in_stack_fffffffffffffc40,(char **)in_stack_fffffffffffffc38);
  file = boost::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  line_num = boost::operator<<(in_stack_fffffffffffffc40,(char **)in_stack_fffffffffffffc38);
  msg = boost::operator<<(in_stack_fffffffffffffc40,(char (*) [14])in_stack_fffffffffffffc38);
  e = boost::operator<<(in_stack_fffffffffffffc40,(uint *)in_stack_fffffffffffffc38);
  writerCalls = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffffc60);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffffc40);
  v_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&stack0xfffffffffffffe18;
  makeValidSchema((char *)in_stack_fffffffffffffe18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2530e5);
  std::auto_ptr<avro::OutputStream>::auto_ptr(local_208,(element_type *)0x0);
  ValidatingEncoderFactory::newEncoder((ValidSchema *)msg);
  testEncoder((EncoderPtr *)e,(char *)writerCalls,v_00,in_stack_fffffffffffffc58);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x253142);
  std::auto_ptr<avro::OutputStream>::operator*(local_208);
  avro::memoryInputStream(local_220);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffdd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc40);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
    ValidatingDecoderFactory::newDecoder((ValidSchema *)msg);
    std::auto_ptr<avro::InputStream>::operator*((auto_ptr<avro::InputStream> *)local_220);
    testDecoder((DecoderPtr *)in_stack_fffffffffffffc50,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc48,(InputStream *)in_stack_fffffffffffffc40,
                *in_stack_fffffffffffffc38,0);
    boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x253215);
    do {
      pv_ = (undefined1)((ulong)in_stack_fffffffffffffc38 >> 0x38);
      in_stack_fffffffffffffc50 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffffda0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc40);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc40,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc48,(char (*) [44])in_stack_fffffffffffffc40)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                 ,0x6d);
      in_stack_fffffffffffffc38 = (char (*) [18])0x0;
      boost::test_tools::tt_detail::report_assertion(&local_288,local_2a8,&local_2b8,0x2e0,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>
                          *)0x2532fc);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x253309);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::auto_ptr<avro::InputStream>::~auto_ptr
            ((auto_ptr<avro::InputStream> *)in_stack_fffffffffffffc40);
  std::auto_ptr<avro::OutputStream>::~auto_ptr
            ((auto_ptr<avro::OutputStream> *)in_stack_fffffffffffffc40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc50);
  ValidSchema::~ValidSchema((ValidSchema *)0x253588);
  return;
}

Assistant:

void testReaderFail(const TestData2& td) {
    static int testNo = 0;
    testNo++;
    BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
        << " schema: " << td.schema
        << " correctCalls: " << td.correctCalls
        << " incorrectCalls: " << td.incorrectCalls
        << " skip-level: " << td.depth);
    ValidSchema vs = makeValidSchema(td.schema);

    vector<string> v;
    auto_ptr<OutputStream> p;
    testEncoder(CodecFactory::newEncoder(vs), td.correctCalls, v, p);
    auto_ptr<InputStream> in = memoryInputStream(*p);
    BOOST_CHECK_THROW(
        testDecoder(CodecFactory::newDecoder(vs), v, *in,
            td.incorrectCalls, td.depth), Exception);
}